

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

int MakeDirectory(char *dirPath)

{
  char cVar1;
  _Bool _Var2;
  size_t sVar3;
  char *dirPath_00;
  int i;
  int iVar4;
  size_t __nmemb;
  
  iVar4 = 1;
  if ((dirPath != (char *)0x0) && (*dirPath != '\0')) {
    _Var2 = DirectoryExists(dirPath);
    iVar4 = 0;
    if (!_Var2) {
      sVar3 = strlen(dirPath);
      __nmemb = (size_t)((int)sVar3 + 1);
      dirPath_00 = (char *)calloc(__nmemb,1);
      memcpy(dirPath_00,dirPath,__nmemb);
      for (iVar4 = 0; iVar4 <= (int)sVar3; iVar4 = iVar4 + 1) {
        cVar1 = dirPath_00[iVar4];
        if (cVar1 == '/') {
LAB_001608ba:
          dirPath_00[iVar4] = '\0';
          _Var2 = DirectoryExists(dirPath_00);
          if (!_Var2) {
            mkdir(dirPath_00,0x1ff);
          }
          dirPath_00[iVar4] = '/';
        }
        else if (cVar1 == ':') {
          iVar4 = iVar4 + 1;
        }
        else {
          if (cVar1 == '\\') goto LAB_001608ba;
          if (cVar1 == '\0') break;
        }
      }
      _Var2 = DirectoryExists(dirPath_00);
      if (!_Var2) {
        mkdir(dirPath_00,0x1ff);
      }
      free(dirPath_00);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int MakeDirectory(const char *dirPath)
{
    if ((dirPath == NULL) || (dirPath[0] == '\0')) return 1; // Path is not valid
    if (DirectoryExists(dirPath)) return 0; // Path already exists (is valid)

    // Copy path string to avoid modifying original
    int len = (int)strlen(dirPath) + 1;
    char *pathcpy = (char *)RL_CALLOC(len, 1);
    memcpy(pathcpy, dirPath, len);

    // Iterate over pathcpy, create each subdirectory as needed
    for (int i = 0; (i < len) && (pathcpy[i] != '\0'); i++)
    {
        if (pathcpy[i] == ':') i++;
        else
        {
            if ((pathcpy[i] == '\\') || (pathcpy[i] == '/'))
            {
                pathcpy[i] = '\0';
                if (!DirectoryExists(pathcpy)) MKDIR(pathcpy);
                pathcpy[i] = '/';
            }
        }
    }

    // Create final directory
    if (!DirectoryExists(pathcpy)) MKDIR(pathcpy);

    RL_FREE(pathcpy);

    return 0;
}